

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freecell.c
# Opt level: O3

MovePack * freecell_movePackGet(Board *board)

{
  ulong uVar1;
  Card *pCVar2;
  byte *pbVar3;
  Card *pCVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  MovePack *movePack;
  Spot *pSVar11;
  Move *pMVar12;
  long lVar13;
  uchar uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  undefined8 uStack_d0;
  int aiStack_c8 [2];
  Spot *apSStack_c0 [2];
  Spot *cells [4];
  Spot *foundations [4];
  
  apSStack_c0[0] = (Spot *)0x103e06;
  movePack = movePack_create();
  uVar1 = (ulong)((gConfig.game)->id == SEAHAVENTOWERS) * 2 + 8;
  lVar7 = -(ulong)(uint)((int)uVar1 * 8);
  lVar8 = lVar7 + -0xb8;
  uVar15 = 0;
  bVar23 = 0;
  do {
    uVar14 = (uchar)uVar15;
    if (uVar15 < 4) {
      *(undefined8 *)((long)apSStack_c0 + lVar7) = 0x103e5e;
      pSVar11 = board_spotGet(board,FOUNDATION,uVar14);
      cells[uVar15 + 3] = pSVar11;
      *(undefined8 *)((long)apSStack_c0 + lVar7) = 0x103e76;
      pSVar11 = board_spotGet(board,CELL,uVar14);
      cells[uVar15 - 1] = pSVar11;
      bVar23 = bVar23 + (pSVar11->cardsCount == '\0');
    }
    *(undefined8 *)((long)apSStack_c0 + lVar7) = 0x103e96;
    pSVar11 = board_spotGet(board,TABLEAU,uVar14);
    *(Spot **)((long)cells + uVar15 * 8 + lVar8 + 0xb0) = pSVar11;
    uVar15 = uVar15 + 1;
  } while (uVar1 != uVar15);
  lVar16 = 0;
  do {
    bVar9 = cells[lVar16 + -1]->cardsCount;
    if (bVar9 != 0) {
      uVar14 = (uchar)lVar16;
      uVar15 = 0;
      pCVar2 = cells[lVar16 + -1]->cards[bVar9 - 1];
      do {
        lVar21 = *(long *)((long)cells + uVar15 * 8 + lVar8 + 0xb0);
        bVar9 = *(byte *)(lVar21 + 2);
        if (bVar9 == 0) {
          if ((((gConfig.game)->id != SEAHAVENTOWERS) && ((gConfig.game)->id != BAKERSGAMEKINGSONLY)
              ) || (pCVar2->rank == '\r')) goto LAB_00103f53;
        }
        else {
          pbVar3 = *(byte **)(*(long *)(lVar21 + 8) + (ulong)(bVar9 - 1) * 8);
          if (pCVar2->rank + 1 == (uint)*pbVar3) {
            if (((gConfig.game)->id < 0x11) && ((0x10006U >> ((gConfig.game)->id & 0x1f) & 1) != 0))
            {
              if (pCVar2->suit == pbVar3[1]) {
LAB_00103f53:
                *(undefined8 *)((long)aiStack_c8 + lVar7) = 0xffffffffffffffff;
                *(undefined8 *)((long)&uStack_d0 + lVar7) = 0x103f77;
                pMVar12 = move_create(MOVE,CELL,uVar14,-1,TABLEAU,(uchar)uVar15,
                                      *(int *)((long)aiStack_c8 + lVar7));
                *(undefined8 *)((long)apSStack_c0 + lVar7) = 0x103f87;
                movePack_add(movePack,pMVar12);
              }
            }
            else if (pCVar2->color != pbVar3[2]) goto LAB_00103f53;
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar1 != uVar15);
      lVar21 = 0;
      do {
        bVar9 = cells[lVar21 + 3]->cardsCount;
        if (bVar9 == 0) {
          if (pCVar2->rank == 1) {
            *(undefined8 *)((long)aiStack_c8 + lVar7) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_d0 + lVar7) = 0x104056;
            pMVar12 = move_create(MOVE,CELL,uVar14,-1,FOUNDATION,(uchar)lVar21,
                                  *(int *)((long)aiStack_c8 + lVar7));
            *(undefined8 *)((long)apSStack_c0 + lVar7) = 0x104066;
            movePack_add(movePack,pMVar12);
            break;
          }
        }
        else {
          pCVar4 = cells[lVar21 + 3]->cards[bVar9 - 1];
          if ((pCVar4->rank + 1 == (uint)pCVar2->rank) && (pCVar2->suit == pCVar4->suit)) {
            *(undefined8 *)((long)aiStack_c8 + lVar7) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_d0 + lVar7) = 0x104004;
            pMVar12 = move_create(MOVE,CELL,uVar14,-1,FOUNDATION,(uchar)lVar21,
                                  *(int *)((long)aiStack_c8 + lVar7));
            *(undefined8 *)((long)apSStack_c0 + lVar7) = 0x104014;
            movePack_add(movePack,pMVar12);
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 4);
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  uVar15 = 0;
  do {
    lVar16 = *(long *)((long)cells + uVar15 * 8 + lVar8 + 0xb0);
    bVar9 = *(byte *)(lVar16 + 2);
    if (bVar9 != 0) {
      lVar21 = 0;
      uVar22 = 0;
      uVar17 = 0;
      do {
        uVar18 = uVar17 + 1;
        if ((int)((uint)bVar9 - (int)uVar22) <= (int)(bVar23 + 1)) {
          pbVar3 = *(byte **)(*(long *)(lVar16 + 8) + uVar17 * 8);
          if (uVar18 < bVar9) {
            lVar13 = *(long *)(lVar16 + 8) + lVar21;
            lVar19 = 1;
            do {
              pbVar5 = *(byte **)(lVar13 + lVar19 * 8);
              pbVar6 = *(byte **)(lVar13 + -8 + lVar19 * 8);
              if (*pbVar5 + 1 != (uint)*pbVar6) goto LAB_0010423a;
              if (((gConfig.game)->id < 0x11) &&
                 ((0x10006U >> ((gConfig.game)->id & 0x1f) & 1) != 0)) {
                if (pbVar5[1] != pbVar6[1]) goto LAB_0010423a;
              }
              else if (pbVar5[2] == pbVar6[2]) goto LAB_0010423a;
              lVar19 = lVar19 + 1;
            } while ((byte)((char)lVar19 + (char)uVar17) < bVar9);
          }
          uVar20 = 0;
          do {
            if (uVar15 != uVar20) {
              lVar13 = *(long *)((long)cells + uVar20 * 8 + lVar8 + 0xb0);
              bVar9 = *(byte *)(lVar13 + 2);
              if ((uVar17 == 0) || (bVar9 != 0)) {
                if ((bVar9 != 0) &&
                   (pbVar5 = *(byte **)(*(long *)(lVar13 + 8) + (ulong)(bVar9 - 1) * 8),
                   *pbVar3 + 1 == (uint)*pbVar5)) {
                  if (((gConfig.game)->id < 0x11) &&
                     ((0x10006U >> ((gConfig.game)->id & 0x1f) & 1) != 0)) {
                    if (pbVar3[1] == pbVar5[1]) {
LAB_001041d9:
                      *(undefined8 *)((long)aiStack_c8 + lVar7) = 0xffffffffffffffff;
                      *(undefined8 *)((long)&uStack_d0 + lVar7) = 0x1041fb;
                      pMVar12 = move_create(MOVE,TABLEAU,(uchar)uVar15,(int)uVar22,TABLEAU,
                                            (uchar)uVar20,*(int *)((long)aiStack_c8 + lVar7));
                      *(undefined8 *)((long)apSStack_c0 + lVar7) = 0x10420b;
                      movePack_add(movePack,pMVar12);
                    }
                  }
                  else if (pbVar3[2] != pbVar5[2]) goto LAB_001041d9;
                }
              }
              else if ((((gConfig.game)->id != SEAHAVENTOWERS) &&
                       ((gConfig.game)->id != BAKERSGAMEKINGSONLY)) || (*pbVar3 == 0xd))
              goto LAB_001041d9;
            }
            uVar20 = uVar20 + 1;
          } while (uVar1 != uVar20);
          bVar9 = *(byte *)(lVar16 + 2);
        }
LAB_0010423a:
        lVar21 = lVar21 + 8;
        uVar22 = uVar18 & 0xffffffff;
        uVar17 = uVar18;
      } while (uVar18 < bVar9);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != uVar1);
  lVar16 = 0;
  while (cells[lVar16 + -1]->cardsCount != '\0') {
    lVar16 = lVar16 + 1;
    if (lVar16 == 4) goto LAB_001042d0;
  }
  uVar15 = 0;
  do {
    if (*(char *)(*(long *)((long)cells + uVar15 * 8 + lVar8 + 0xb0) + 2) != '\0') {
      *(undefined8 *)((long)aiStack_c8 + lVar7) = 0xffffffffffffffff;
      *(undefined8 *)((long)&uStack_d0 + lVar7) = 0x1042b4;
      pMVar12 = move_create(MOVE,TABLEAU,(uchar)uVar15,-1,CELL,(uchar)lVar16,
                            *(int *)((long)aiStack_c8 + lVar7));
      *(undefined8 *)((long)apSStack_c0 + lVar7) = 0x1042c4;
      movePack_add(movePack,pMVar12);
    }
    uVar15 = uVar15 + 1;
  } while (uVar1 != uVar15);
LAB_001042d0:
  uVar15 = 0;
  do {
    lVar16 = *(long *)((long)cells + uVar15 * 8 + lVar8 + 0xb0);
    bVar23 = *(byte *)(lVar16 + 2);
    if (bVar23 != 0) {
      lVar21 = 0;
      pbVar3 = *(byte **)(*(long *)(lVar16 + 8) + (ulong)(bVar23 - 1) * 8);
      do {
        bVar23 = cells[lVar21 + 3]->cardsCount;
        uVar10 = (uint)*pbVar3;
        if (bVar23 == 0) {
          if (uVar10 == 1) {
            *(undefined8 *)((long)aiStack_c8 + lVar7) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_d0 + lVar7) = 0x1043ad;
            pMVar12 = move_create(MOVE,TABLEAU,(uchar)uVar15,-1,FOUNDATION,(uchar)lVar21,
                                  *(int *)((long)aiStack_c8 + lVar7));
            *(undefined8 *)((long)apSStack_c0 + lVar7) = 0x1043bd;
            movePack_add(movePack,pMVar12);
            break;
          }
        }
        else {
          pCVar2 = cells[lVar21 + 3]->cards[bVar23 - 1];
          if ((pCVar2->rank + 1 == uVar10) && (pbVar3[1] == pCVar2->suit)) {
            *(undefined8 *)((long)aiStack_c8 + lVar7) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_d0 + lVar7) = 0x10435f;
            pMVar12 = move_create(MOVE,TABLEAU,(uchar)uVar15,-1,FOUNDATION,(uchar)lVar21,
                                  *(int *)((long)aiStack_c8 + lVar7));
            *(undefined8 *)((long)apSStack_c0 + lVar7) = 0x10436f;
            movePack_add(movePack,pMVar12);
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 4);
    }
    uVar15 = uVar15 + 1;
    if (uVar15 == uVar1) {
      return movePack;
    }
  } while( true );
}

Assistant:

MovePack * freecell_movePackGet(Board * board)
{
	MovePack * movePack = movePack_create();
	unsigned char i, j, k;
	unsigned char openCellCount=0;
	unsigned char tableauCount = gConfig.game->id==SEAHAVENTOWERS ? 10 : 8;
	bool correctlyStacked;
	Spot * cells[4];
	Spot * foundations[4];
	Spot * tableaus[tableauCount];
	Card * card;

	for(i=0;i<tableauCount;i++)
	{
		if(i<4)
		{
			foundations[i] = board_spotGet(board, FOUNDATION, i);
			cells[i] = board_spotGet(board, CELL, i);
			if(cells[i]->cardsCount==0)
				openCellCount++;
		}
		tableaus[i] = board_spotGet(board, TABLEAU, i);
	}

	// Cell
	for(i=0;i<4;i++)
	{
		if(cells[i]->cardsCount==0)
			continue;

		card = cells[i]->cards[cells[i]->cardsCount-1];

		// Cell->Tableau
		for(j=0;j<tableauCount;j++)
		{
			if((tableaus[j]->cardsCount==0 && ((gConfig.game->id!=BAKERSGAMEKINGSONLY && gConfig.game->id!=SEAHAVENTOWERS) || card->rank==13)) || (tableaus[j]->cardsCount>0 && freecell_validCardTableauDrop(card, tableaus[j]->cards[tableaus[j]->cardsCount-1])))
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, TABLEAU, j, -1));
		}

		// Cell->Foundation
		for(j=0;j<4;j++)
		{
			if(foundations[j]->cardsCount==0 && card->rank==1)
			{
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, FOUNDATION, j, -1));
				// All empty foundations are created equal, if moving an Ace, there is no need to entertain moving to the other foundations
				break;
			}
			else if(foundations[j]->cardsCount>0 && card->rank==foundations[j]->cards[foundations[j]->cardsCount-1]->rank+1 && card->suit==foundations[j]->cards[foundations[j]->cardsCount-1]->suit)
			{
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, FOUNDATION, j, -1));
			}
		}
	}

	// Tableau->Tableau
	for(i=0;i<tableauCount;i++)
	{
		if(tableaus[i]->cardsCount==0)
			continue;

		for(j=0;j<tableaus[i]->cardsCount;j++)
		{
			card = tableaus[i]->cards[j];

			// Ensure stack not too long
			if((tableaus[i]->cardsCount-j)>(openCellCount+1))
				continue;

			// And is correctly stacked
			for(correctlyStacked=true,k=(j+1);k<tableaus[i]->cardsCount;k++)
			{
				if(!freecell_validCardTableauDrop(tableaus[i]->cards[k], tableaus[i]->cards[(k-1)]))
				{
					correctlyStacked = false;
					break;
				}
			}

			if(!correctlyStacked)
				continue;

			//printf("tableau %d at index %d has correctly ranked card: %s\n", i, j, card_print(card, false));

			for(k=0;k<tableauCount;k++)
			{
				if(k==i)
					continue;

				if((tableaus[k]->cardsCount==0 && j>0 && ((gConfig.game->id!=BAKERSGAMEKINGSONLY && gConfig.game->id!=SEAHAVENTOWERS) || card->rank==13)) ||
				   (tableaus[k]->cardsCount>0 && freecell_validCardTableauDrop(card, tableaus[k]->cards[tableaus[k]->cardsCount-1])))
				{
					movePack_add(movePack, move_create(MOVE, TABLEAU, i, j, TABLEAU, k, -1));
				}
			}
		}
	}

	// Tableau->Cell
	for(i=0;i<4;i++)
	{
		if(cells[i]->cardsCount>0)
			continue;

		for(j=0;j<tableauCount;j++)
		{
			if(tableaus[j]->cardsCount==0)
				continue;

			movePack_add(movePack, move_create(MOVE, TABLEAU, j, -1, CELL, i, -1));
		}

		break;
	}

	// Tableau->Foundation
	for(i=0;i<tableauCount;i++)
	{
		if(tableaus[i]->cardsCount==0)
			continue;

		card = tableaus[i]->cards[tableaus[i]->cardsCount-1];

		for(j=0;j<4;j++)
		{
			if(foundations[j]->cardsCount==0 && card->rank==1)
			{
				movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, j, -1));
				// All empty foundations are created equal, if moving an Ace, there is no need to entertain moving to the other foundations
				break;
			   
			}
			else if(foundations[j]->cardsCount>0 && card->rank==foundations[j]->cards[foundations[j]->cardsCount-1]->rank+1 && card->suit==foundations[j]->cards[foundations[j]->cardsCount-1]->suit)
			{
				movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, j, -1));
			}
		}
	}

	return movePack;
}